

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTPNInh::gen_code_member
          (CTPNInh *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  int iVar1;
  CTcSymFunc *func;
  undefined4 in_EAX;
  uint uVar2;
  CTPNCodeBody *this_00;
  CTcCodeStream *prop_expr_00;
  CTcCodeStream *__n;
  CTcGenTarg *pCVar3;
  int iVar4;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT44(discard,in_EAX);
  if ((~G_cg->field_0xd0 & 0x18) == 0) {
    err_throw(0x9c5);
  }
  this_00 = G_cs->code_body_;
  iVar4 = argc;
  prop_expr_00 = G_cs;
  __n = G_cs;
  while( true ) {
    G_cs = __n;
    if (this_00 == (CTPNCodeBody *)0x0) {
      if ((__n->field_0xa8 & 1) == 0) {
        CTcTokenizer::log_error(0x2cef);
      }
      if ((this->super_CTPNInhBase).typelist_ != (CTcFormalTypeList *)0x0) {
        CTcTokenizer::log_error(0x2d26);
      }
      uVar2 = (*(prop_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                        (prop_expr,0,(ulong)(uint)prop_is_expr);
      if ((short)uVar2 == 0) {
        if (varargs != 0) {
          CTcGenTarg::write_op(G_cg,0x8d);
          CTcGenTarg::write_op(G_cg,'v');
        }
        CTcGenTarg::write_op(G_cg,'s');
        uStack_38._0_4_ = CONCAT13((char)argc,(undefined3)uStack_38);
        pCVar3 = (CTcGenTarg *)G_cs;
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 3,(void *)0x1,(size_t)__n)
        ;
        G_cg->sp_depth_ = G_cg->sp_depth_ + ~argc;
      }
      else {
        if (varargs != 0) {
          CTcGenTarg::write_op(G_cg,'v');
        }
        CTcGenTarg::write_op(G_cg,'r');
        uStack_38._0_3_ = CONCAT12((char)argc,(undefined2)uStack_38);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 2,(void *)0x1,(size_t)__n)
        ;
        pCVar3 = (CTcGenTarg *)G_cs;
        CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar2 & 0xffff);
        G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
      }
      CTcGenTarg::post_call_cleanup(pCVar3,named_args);
      if (uStack_38._4_4_ == 0) {
        CTcGenTarg::write_op(G_cg,0x8b);
        pCVar3 = G_cg;
        iVar1 = G_cg->sp_depth_;
        iVar4 = iVar1 + 1;
        G_cg->sp_depth_ = iVar4;
        if (pCVar3->max_sp_depth_ <= iVar1) {
          pCVar3->max_sp_depth_ = iVar4;
        }
      }
      return;
    }
    func = (this_00->super_CTPNCodeBodyBase).fixup_owner_sym_;
    if ((func != (CTcSymFunc *)0x0) && (((func->super_CTcSymFuncBase).field_0x80 & 0x10) != 0))
    break;
    this_00 = CTPNCodeBodyBase::get_enclosing(&this_00->super_CTPNCodeBodyBase);
    __n = G_cs;
  }
  uStack_38._4_4_ = (int)((ulong)uStack_38 >> 0x20);
  iVar1 = uStack_38._4_4_;
  gen_code_mminh(this,func,iVar1,(CTcPrsNode *)prop_expr_00,iVar4,argc,varargs,named_args);
  return;
}

Assistant:

void CTPNInh::gen_code_member(int discard,
                              CTcPrsNode *prop_expr, int prop_is_expr,
                              int argc, int varargs, CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* don't allow 'inherited' in speculative evaluation mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /*
     *   If we're in a multi-method context, inherited() has a different
     *   meaning from the ordinary method context meaning.
     */
    for (CTPNCodeBody *cb = G_cs->get_code_body() ; cb != 0 ;
         cb = cb->get_enclosing())
    {
        /* check for a multi-method context */
        CTcSymFunc *f = cb->get_func_sym();
        if (f != 0 && f->is_multimethod())
        {
            /* generate the multi-method inherited() code */
            gen_code_mminh(f, discard, prop_expr, prop_is_expr,
                           argc, varargs, named_args);

            /* we're done */
            return;
        }
    }

    /* 
     *   make sure "self" is available - we obviously can't inherit
     *   anything if we're not in an object's method 
     */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* a type list ('inherited<>') is invalid for regular method inheritance */
    if (typelist_ != 0)
        G_tok->log_error(TCERR_MMINH_BAD_CONTEXT);

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple INHERIT;
     *   otherwise, generate a PTRINHERIT 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* generate a varargs modifier if necessary */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);
        
        /* we have a constant property ID - generate a regular INHERIT */
        G_cg->write_op(OPC_INHERIT);
        G_cs->write((char)argc);
        G_cs->write_prop_id(prop);

        /* this removes arguments */
        G_cg->note_pop(argc);
    }
    else
    {
        /* 
         *   if we have a varargs list, modify the call instruction that
         *   follows to make it a varargs call 
         */
        if (varargs)
        {
            /* swap the top of the stack to get the arg counter back on top */
            G_cg->write_op(OPC_SWAP);
            
            /* write the varargs modifier */
            G_cg->write_op(OPC_VARARGC);
        }

        /* a property pointer is on the stack - write a PTRINHERIT */
        G_cg->write_op(OPC_PTRINHERIT);
        G_cs->write((int)argc);

        /* this removes arguments and the property pointer */
        G_cg->note_pop(argc + 1);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}